

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall
YAJLScan::YAJLScan(YAJLScan *this,YAJLMiscData *misc,YAJLFrameHeader *fheader,bitio_stream *bstream)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ssize_t sVar4;
  size_type *this_00;
  reference pYVar5;
  reference pvVar6;
  reference pvVar7;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  void *extraout_RDX_04;
  double dVar8;
  reference local_c0;
  YAJLScan *local_b8;
  int local_ac;
  value_type local_a8;
  int r;
  value_type fspec;
  int cmp_id;
  int sampling_factor;
  int i;
  int sfactor;
  YAJLFrameHeaderSpec spec;
  iterator __end7;
  iterator __begin7;
  vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *__range7;
  uint uStack_70;
  u8 max_sampling_factor;
  u32 mcu_max_count;
  u32 mcu_count;
  int index;
  u16 local_2c;
  byte local_29;
  u16 marker;
  bitio_stream *pbStack_28;
  bool run;
  bitio_stream *bstream_local;
  YAJLFrameHeader *fheader_local;
  YAJLMiscData *misc_local;
  YAJLScan *this_local;
  
  pbStack_28 = bstream;
  bstream_local = (bitio_stream *)fheader;
  fheader_local = (YAJLFrameHeader *)misc;
  misc_local = (YAJLMiscData *)this;
  YAJLTables::YAJLTables(&this->tables);
  YAJLScanHeader::YAJLScanHeader(&this->header);
  std::vector<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>::vector(&this->mcus);
  local_29 = 1;
  __buf = extraout_RDX;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if ((local_29 & 1) == 0) {
              return;
            }
            sVar4 = bitio::bitio_stream::read(pbStack_28,0x10,__buf,(size_t)bstream);
            local_2c = (u16)sVar4;
            bVar2 = markers::is_app_marker(local_2c);
            if (!bVar2) break;
            YAJLMiscData::fetch_app_data((YAJLMiscData *)fheader_local,pbStack_28);
            __buf = extraout_RDX_00;
          }
          if (local_2c != 0xfffe) break;
          YAJLMiscData::fetch_comment((YAJLMiscData *)fheader_local,pbStack_28);
          __buf = extraout_RDX_01;
        }
        if (local_2c != 0xffdb) break;
        YAJLTables::fetch_qtable(&this->tables,pbStack_28);
        __buf = extraout_RDX_02;
      }
      if ((local_2c != 0xffc4) && (local_2c != 0xffcc)) break;
      YAJLTables::fetch_etable(&this->tables,local_2c,pbStack_28);
      __buf = extraout_RDX_03;
    }
    if (local_2c != 0xffda) break;
    YAJLScanHeader::YAJLScanHeader((YAJLScanHeader *)&mcu_count,pbStack_28);
    YAJLScanHeader::operator=(&this->header,(YAJLScanHeader *)&mcu_count);
    YAJLScanHeader::~YAJLScanHeader((YAJLScanHeader *)&mcu_count);
    mcu_max_count = 0;
    uStack_70 = 0;
    __range7._4_4_ = 0;
    __range7._3_1_ = 0;
    this_00 = &(bstream_local->filename)._M_string_length;
    __end7 = std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::begin
                       ((vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *)this_00
                       );
    _sfactor = std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::end
                         ((vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *)
                          this_00);
    while (bVar2 = __gnu_cxx::
                   operator==<YAJLFrameHeaderSpec_*,_std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>_>
                             (&__end7,(__normal_iterator<YAJLFrameHeaderSpec_*,_std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>_>
                                       *)&sfactor), ((bVar2 ^ 0xffU) & 1) != 0) {
      pYVar5 = __gnu_cxx::
               __normal_iterator<YAJLFrameHeaderSpec_*,_std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>_>
               ::operator*(&__end7);
      uVar3 = ((uint)*pYVar5 >> 8 & 0xff) * ((uint)*pYVar5 >> 0x10 & 0xff);
      if (__range7._3_1_ < uVar3) {
        __range7._3_1_ = (byte)uVar3;
      }
      __gnu_cxx::
      __normal_iterator<YAJLFrameHeaderSpec_*,_std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>_>
      ::operator++(&__end7);
    }
    for (cmp_id = 0; bVar1 = (this->header).ncomponents, cmp_id < (int)(uint)bVar1;
        cmp_id = cmp_id + 1) {
      pvVar6 = std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::operator[]
                         ((vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *)
                          &(bstream_local->filename)._M_string_length,(long)cmp_id);
      bVar1 = pvVar6->horizontal_sampling_factor;
      pvVar6 = std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::operator[]
                         ((vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *)
                          &(bstream_local->filename)._M_string_length,(long)cmp_id);
      fspec = (value_type)((uint)bVar1 * (uint)pvVar6->vertical_sampling_factor);
      dVar8 = ceil((double)(((float)(int)((uint)*(ushort *)((long)&bstream_local->file + 4) *
                                         (uint)*(ushort *)((long)&bstream_local->file + 6)) *
                            (float)(int)fspec) / (float)((uint)__range7._3_1_ << 6)));
      __range7._4_4_ = (uint)(long)((double)__range7._4_4_ + dVar8);
    }
    while (bstream = (bitio_stream *)(ulong)bVar1, uStack_70 < __range7._4_4_) {
      pvVar7 = std::vector<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>::operator[]
                         (&(this->header).specs,(long)(int)mcu_max_count);
      r = pvVar7->component_selector - 1;
      pvVar6 = std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::operator[]
                         ((vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *)
                          &(bstream_local->filename)._M_string_length,(long)r);
      local_a8 = *pvVar6;
      for (local_ac = 0;
          local_ac < (int)(((uint)local_a8 >> 0x10 & 0xff) * ((uint)local_a8 >> 8 & 0xff));
          local_ac = local_ac + 1) {
        local_b8 = this;
        local_c0 = std::vector<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>::operator[]
                             (&(this->header).specs,(long)r);
        std::vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>>::
        emplace_back<bitio::bitio_stream*&,YAJLTables*,YAJLScanHeaderSpec*>
                  ((vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>> *)&this->mcus,
                   &stack0xffffffffffffffd8,(YAJLTables **)&local_b8,&local_c0);
        uStack_70 = uStack_70 + 1;
      }
      bVar1 = (this->header).ncomponents;
      mcu_max_count = (int)(mcu_max_count + 1) % (int)(uint)bVar1;
    }
    bitio::bitio_stream::force_align(pbStack_28);
    sVar4 = bitio::bitio_stream::read(pbStack_28,0x10,__buf_00,(size_t)bstream);
    printf("%x\n",sVar4);
    printf("Run completed at: %s for \'Scan\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
          );
    local_29 = 0;
    __buf = extraout_RDX_04;
  }
  fprintf(_stderr,"Unhandled marker at: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
         );
  exit(1);
}

Assistant:

YAJLScan::YAJLScan(YAJLMiscData *misc, YAJLFrameHeader *fheader, bitio::bitio_stream *bstream) {
    // we fill YAJLScan with data fetch directly over bitio streams.
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::SOS) {
            header = YAJLScanHeader(bstream);
            // scan for MCUs here
            // if Ns > 1, then the MCUs are interleaved. refer B.2.3 from ISO 10918
            // the interleaved components are ordered in this fashion: Cs1, Cs2 ... Csj

            int index = 0;
            u32 mcu_count = 0;
            u32 mcu_max_count = 0;
            u8 max_sampling_factor = 0;
            for (auto spec : fheader->specs) {
                auto sfactor = spec.horizontal_sampling_factor * spec.vertical_sampling_factor;
                if (max_sampling_factor < sfactor) {
                    max_sampling_factor = sfactor;
                }
            }

            for (int i = 0; i < header.ncomponents; i++) {
                auto sampling_factor = fheader->specs[i].horizontal_sampling_factor * fheader->specs[i].vertical_sampling_factor;
                mcu_max_count += ceil((float) (fheader->nlines * fheader->nsamples_per_line) * sampling_factor / (64 * max_sampling_factor));
            }

            while (mcu_count < mcu_max_count) {

                auto cmp_id = header.specs[index].component_selector - 1;
                auto fspec = fheader->specs[cmp_id];
                for (int r = 0; r < fspec.vertical_sampling_factor * fspec.horizontal_sampling_factor; r++) {
                    mcus.emplace_back(bstream, &tables, &header.specs[cmp_id]);
                    mcu_count++;
                }
                index = (index + 1) % header.ncomponents;
            }

            bstream->force_align();
            printf("%x\n", bstream->read(0x10));

#ifdef DEBUG
            printf("Run completed at: %s for 'Scan'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}